

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::getViscTerms(PeleLM *this,MultiFab *visc_terms,int src_comp,int num_comp,Real time)

{
  Geometry *this_00;
  MultiFab *mf;
  PeleLM *pPVar1;
  FabArray<amrex::FArrayBox> *mf_00;
  TimeLevel TVar2;
  ostream *os_;
  Print *pPVar3;
  long lVar4;
  double dVar5;
  allocator local_232;
  allocator local_231;
  PeleLM *local_230;
  MultiFab **local_228;
  Real local_220;
  FabArray<amrex::FArrayBox> *local_218;
  int local_20c;
  FluxBoxes fb;
  string local_1f8;
  string local_1d8;
  Print local_1b8;
  
  local_230 = this;
  local_220 = time;
  dVar5 = amrex::ParallelDescriptor::second();
  local_20c = (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
  local_218 = &visc_terms->super_FabArray<amrex::FArrayBox>;
  amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
            (&visc_terms->super_FabArray<amrex::FArrayBox>,1e+30);
  if (src_comp < 3) {
    if (src_comp != 0 || num_comp < 3) {
      amrex::Error_host("tensor v -> getViscTerms needs all v-components at once");
    }
    pPVar1 = local_230;
    FluxBoxes::FluxBoxes(&fb,(AmrLevel *)local_230,1,0);
    local_228 = fb.data;
    (*(pPVar1->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x32])(local_220,pPVar1);
    for (lVar4 = 0; pPVar1 = local_230, lVar4 != 3; lVar4 = lVar4 + 1) {
      std::__cxx11::string::string((string *)&local_1b8,"velVT",&local_232);
      mf = local_228[lVar4];
      std::__cxx11::string::string((string *)&local_1d8,"velVT_viscn_",&local_231);
      amrex::Concatenate(&local_1f8,&local_1d8,(int)lVar4,1);
      showMF((string *)&local_1b8,mf,&local_1f8,
             (local_230->super_NavierStokesBase).super_AmrLevel.level,-1,-1);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    TVar2 = amrex::AmrLevel::which_time((AmrLevel *)local_230,0,local_220);
    Diffusion::getTensorViscTerms
              ((pPVar1->super_NavierStokesBase).diffusion,(MultiFab *)local_218,local_220,local_228,
               (&(pPVar1->super_NavierStokesBase).viscn_cc)[TVar2 != AmrOldTime],0);
    std::__cxx11::string::string((string *)&local_1b8,"velVT",(allocator *)&local_1d8);
    std::__cxx11::string::string((string *)&local_1f8,"velVT_visc_terms_1",&local_232);
    showMF((string *)&local_1b8,(MultiFab *)local_218,&local_1f8,
           (local_230->super_NavierStokesBase).super_AmrLevel.level,-1,-1);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1b8);
    FluxBoxes::~FluxBoxes(&fb);
  }
  else {
    amrex::Abort_host("Should only call getViscTerms for velocity");
  }
  if (0 < local_20c) {
    this_00 = &(local_230->super_NavierStokesBase).super_AmrLevel.geom;
    local_1b8._0_12_ = amrex::Geometry::periodicity(this_00);
    mf_00 = local_218;
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (local_218,0,num_comp,(Periodicity *)&local_1b8,false);
    amrex::Extrapolater::FirstOrderExtrap
              ((MultiFab *)mf_00,this_00,0,num_comp,(mf_00->super_FabArrayBase).n_grow.vect[0]);
  }
  if (2 < NavierStokesBase::verbose) {
    local_228 = (MultiFab **)amrex::ParallelDescriptor::second();
    os_ = amrex::OutStream();
    amrex::Print::Print(&local_1b8,os_);
    std::operator<<((ostream *)(((IntVect *)&local_1b8)[1].vect + 1),
                    "      PeleLM::getViscTerms(): lev: ");
    pPVar3 = amrex::Print::operator<<
                       (&local_1b8,&(local_230->super_NavierStokesBase).super_AmrLevel.level);
    std::operator<<((ostream *)&pPVar3->ss,", time: ");
    std::ostream::_M_insert<double>((double)local_228 - dVar5);
    std::operator<<((ostream *)&pPVar3->ss,'\n');
    amrex::Print::~Print(&local_1b8);
  }
  return;
}

Assistant:

void
PeleLM::getViscTerms (MultiFab& visc_terms,
                      int       src_comp,
                      int       num_comp,
                      Real      time)
{
   BL_PROFILE("PLM::getViscTerms()");
   const Real strt_time = ParallelDescriptor::second();
   //
   // Load "viscous" terms, starting from component = 0.
   //
   // JFG: for species, this procedure returns the *negative* of the divergence of
   // of the diffusive fluxes.  specifically, in the mixture averaged case, the
   // diffusive flux vector for species k is
   //
   //       j_k = - rho D_k,mix grad Y_k
   //
   // so the divergence of the flux, div dot j_k, has a negative in it.  instead
   // this procedure returns - div dot j_k to remove the negative.
   //
   // note the fluxes used in the code are extensive, that is, scaled by the areas
   // of the cell edges.  the calculation of the divergence is the sum of un-divided
   // differences of the extensive fluxes, all divided by volume.  so the effect is
   // to give the true divided difference approximation to the divergence of the
   // intensive flux.

   const int  nGrow     = visc_terms.nGrow();
   //
   // Get Div(tau) from the tensor operator, if velocity and have non-const viscosity
   //
   visc_terms.setBndry(1.e30);
   if (src_comp < AMREX_SPACEDIM)
   {
      if (src_comp != Xvel || num_comp < AMREX_SPACEDIM)
         amrex::Error("tensor v -> getViscTerms needs all v-components at once");

      FluxBoxes fb(this);
      MultiFab** vel_visc = fb.get();
      getViscosity(vel_visc, time);

      for (int dir=0; dir<AMREX_SPACEDIM; ++dir) {
         showMF("velVT",*(vel_visc[dir]),amrex::Concatenate("velVT_viscn_",dir,1),level);
      }
      int viscComp = 0;
      const TimeLevel whichTime = which_time(State_Type,time);
      AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
      auto vel_visc_cc = (whichTime == AmrOldTime ? viscn_cc : viscnp1_cc);
      diffusion->getTensorViscTerms(visc_terms,time,vel_visc,vel_visc_cc,viscComp);

      showMF("velVT",visc_terms,"velVT_visc_terms_1",level);
   }
   else
   {
     amrex::Abort("Should only call getViscTerms for velocity");
   }

   //
   // Ensure consistent grow cells
   //
   if (nGrow > 0)
   {
      visc_terms.FillBoundary(0,num_comp, geom.periodicity());
      Extrapolater::FirstOrderExtrap(visc_terms, geom, 0, num_comp, visc_terms.nGrow());
   }

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::getViscTerms(): lev: " << level
                     << ", time: " << run_time << '\n';
   }
}